

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processestimator.cxx
# Opt level: O1

void __thiscall ProcessEstimator::collect(ProcessEstimator *this)

{
  uint uVar1;
  double extraout_XMM0_Qa;
  
  if (this->nCurrent < this->nLength) {
    (*(((this->super_Estimator).pSource)->super_Parametric)._vptr_Parametric
      [(ulong)(((this->super_Estimator).nEstimate & 0x40) == 0) + 7])();
    uVar1 = this->nCurrent;
    this->aSample[uVar1] = extraout_XMM0_Qa;
    this->nCurrent = uVar1 + 1;
  }
  return;
}

Assistant:

void ProcessEstimator::collect()
{
	// eat next data point, without stepping stoch. variable
	if(nCurrent < nLength) {
		if( nEstimate & EST_DIFF )
			aSample[nCurrent] = pSource->getIncrement();
		else
			aSample[nCurrent] = pSource->getCurrentValue();
		++nCurrent;
	}
}